

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::Value,_true> *ret)

{
  undefined6 in_register_00000032;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_30 [24];
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000032,field_id));
  Read<duckdb::vector<duckdb::Value,true>>((type *)local_30,this);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::_M_move_assign
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)ret,local_30);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_30);
  (*this->_vptr_Deserializer[3])(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}